

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameWithClusterInfo.cpp
# Opt level: O1

Index __thiscall
BayesianGameWithClusterInfo::FindTypeClusterIndex
          (BayesianGameWithClusterInfo *this,Index agI,TypeCluster *tc_previous,Index aI,Index oI)

{
  pointer ppvVar1;
  vector<TypeCluster_*,_std::allocator<TypeCluster_*>_> *pvVar2;
  pointer ppTVar3;
  TypeCluster *pTVar4;
  bool bVar5;
  long lVar6;
  _Rb_tree_node_base *p_Var7;
  E *this_00;
  _Self __tmp;
  pointer ppTVar8;
  Index IVar9;
  Index local_44;
  
  ppvVar1 = (this->_m_typeLists).
            super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->_m_typeLists).
                    super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppvVar1 >> 3) <= (ulong)agI)
  {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  }
  pvVar2 = ppvVar1[agI];
  ppTVar8 = (pvVar2->super__Vector_base<TypeCluster_*,_std::allocator<TypeCluster_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppTVar3 = *(pointer *)
             ((long)&(pvVar2->super__Vector_base<TypeCluster_*,_std::allocator<TypeCluster_*>_>).
                     _M_impl.super__Vector_impl_data + 8);
  IVar9 = 0;
  if (ppTVar8 == ppTVar3) {
    local_44 = 0x2a;
    bVar5 = false;
  }
  else {
    local_44 = 0x2a;
    bVar5 = false;
    do {
      pTVar4 = *ppTVar8;
      p_Var7 = *(_Base_ptr *)((long)&(pTVar4->_m_types)._M_t._M_impl + 0x18);
      while ((p_Var7 != (_Rb_tree_node_base *)((long)&(pTVar4->_m_types)._M_t._M_impl + 8U) &&
             (!bVar5))) {
        if ((*(int *)(*(long *)(p_Var7 + 1) + 8) == 2) &&
           (((lVar6 = __dynamic_cast(*(long *)(p_Var7 + 1),&Type::typeinfo,
                                     &Type_PointerTuple::typeinfo,0),
             *(TypeCluster **)(lVar6 + 0x10) == tc_previous && (*(Index *)(lVar6 + 0x18) == aI)) &&
            (*(Index *)(lVar6 + 0x1c) == oI)))) {
          bVar5 = true;
          local_44 = IVar9;
        }
        p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
      }
      ppTVar8 = ppTVar8 + 1;
    } while ((ppTVar8 != ppTVar3) && (IVar9 = IVar9 + 1, !bVar5));
  }
  if (!bVar5) {
    this_00 = (E *)__cxa_allocate_exception(0x28);
    E::E(this_00,"BayesianGameWithClusterInfo::FindTypeClusterIndex - no matching type found!");
    __cxa_throw(this_00,&E::typeinfo,E::~E);
  }
  return local_44;
}

Assistant:

Index 
BayesianGameWithClusterInfo::FindTypeClusterIndex(
        Index agI, const TypeCluster* tc_previous, 
    Index aI, Index oI) const
{
    const TypeClusterList* tcl = _m_typeLists.at(agI);
    typeC_ci it = tcl->begin();
    typeC_ci last = tcl->end();

    Index tcI = 0; 
    Index foundtcI = 42;
    bool finished = false;
    while(it != last && !finished)
    {
        const TypeCluster* tc = *it;
        TypeCluster::type_ci it2 = tc->begin();
        TypeCluster::type_ci last2 = tc->end();
        while(it2 != last2  && !finished )
        {
            const Type* t1 = *it2;
            if(t1->GetSubClass() == Type::POINTERTUPLE)
            {
                const Type_PointerTuple* t = dynamic_cast
                    <const Type_PointerTuple*>(t1);
                if( tc_previous == t->GetPredecessor() &&
                    aI == t->GetAction() &&
                    oI == t->GetObservation() )
                {
                    finished = true;
                    foundtcI = tcI;
                }
            }
            it2++;
        }
        tcI++;
        it++;
    }
    if(!finished)
        throw E("BayesianGameWithClusterInfo::FindTypeClusterIndex - no matching type found!");

    return(foundtcI);
}